

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O0

bool __thiscall
lzham::lzcompressor::state::encode
          (state *this,symbol_codec *codec,CLZBase *lzbase,search_accelerator *dict,
          lzdecision *lzdec)

{
  bool bVar1;
  int iVar2;
  uint sym;
  uint uVar3;
  CLZBase *in_RDX;
  state *in_RSI;
  state *in_RDI;
  lzdecision *in_R8;
  uint num_extra_bits;
  uint main_sym;
  uint match_high_sym;
  int large_len_sym;
  uint match_low_sym;
  uint match_extra;
  uint match_slot;
  int dist_1;
  int dist;
  int match_hist_index;
  uint lit_pred_1;
  uint delta_lit;
  uint rep_lit1;
  uint rep_lit0;
  uint lit_pred;
  uint lit_pred1;
  uint lit;
  uint is_match_model_index;
  uint lit_pred0;
  int in_stack_ffffffffffffff68;
  uint in_stack_ffffffffffffff6c;
  state *in_stack_ffffffffffffff78;
  uint in_stack_ffffffffffffff84;
  bool update_model;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  int local_70;
  uint in_stack_ffffffffffffff94;
  uint uVar4;
  uint in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffff9c;
  
  get_pred_char(in_stack_ffffffffffffff78,(search_accelerator *)in_RDI,in_stack_ffffffffffffff6c,
                in_stack_ffffffffffffff68);
  lzdecision::is_match(in_R8);
  bVar1 = symbol_codec::encode
                    ((symbol_codec *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                     in_stack_ffffffffffffff94,
                     (adaptive_bit_model *)
                     CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                     SUB41(in_stack_ffffffffffffff84 >> 0x18,0));
  if (!bVar1) {
    return false;
  }
  bVar1 = lzdecision::is_match(in_R8);
  if (bVar1) {
    bVar1 = SUB41(in_stack_ffffffffffffff84 >> 0x18,0);
    if (in_R8->m_dist < 0) {
      bVar1 = symbol_codec::encode
                        ((symbol_codec *)
                         CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                         in_stack_ffffffffffffff94,
                         (adaptive_bit_model *)
                         CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),bVar1);
      if (!bVar1) {
        return false;
      }
      iVar2 = in_R8->m_dist;
      bVar1 = SUB41(in_stack_ffffffffffffff84 >> 0x18,0);
      if (iVar2 == -1) {
        bVar1 = symbol_codec::encode
                          ((symbol_codec *)
                           CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                           in_stack_ffffffffffffff94,
                           (adaptive_bit_model *)
                           CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),bVar1);
        if (!bVar1) {
          return false;
        }
        bVar1 = SUB41(in_stack_ffffffffffffff84 >> 0x18,0);
        if (in_R8->m_len == 1) {
          bVar1 = symbol_codec::encode
                            ((symbol_codec *)
                             CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                             in_stack_ffffffffffffff94,
                             (adaptive_bit_model *)
                             CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),bVar1);
          if (!bVar1) {
            return false;
          }
          uVar3 = 0xb;
          if ((in_RDI->super_state_base).m_cur_state < 7) {
            uVar3 = 9;
          }
          (in_RDI->super_state_base).m_cur_state = uVar3;
        }
        else {
          bVar1 = symbol_codec::encode
                            ((symbol_codec *)
                             CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                             in_stack_ffffffffffffff94,
                             (adaptive_bit_model *)
                             CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),bVar1);
          if (!bVar1) {
            return false;
          }
          bVar1 = symbol_codec::encode
                            ((symbol_codec *)
                             CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                             in_stack_ffffffffffffff84,(quasi_adaptive_huffman_data_model *)in_RSI);
          if (!bVar1) {
            return false;
          }
          uVar3 = 0xb;
          if ((in_RDI->super_state_base).m_cur_state < 7) {
            uVar3 = 8;
          }
          (in_RDI->super_state_base).m_cur_state = uVar3;
        }
      }
      else {
        bVar1 = symbol_codec::encode
                          ((symbol_codec *)
                           CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                           in_stack_ffffffffffffff94,
                           (adaptive_bit_model *)
                           CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),bVar1);
        if (!bVar1) {
          return false;
        }
        bVar1 = symbol_codec::encode
                          ((symbol_codec *)
                           CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                           in_stack_ffffffffffffff84,(quasi_adaptive_huffman_data_model *)in_RSI);
        update_model = SUB41(in_stack_ffffffffffffff84 >> 0x18,0);
        if (!bVar1) {
          return false;
        }
        if (iVar2 == -2) {
          bVar1 = symbol_codec::encode
                            ((symbol_codec *)
                             CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                             in_stack_ffffffffffffff94,
                             (adaptive_bit_model *)
                             CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                             update_model);
          if (!bVar1) {
            return false;
          }
          std::swap<unsigned_int>
                    ((in_RDI->super_state_base).m_match_hist,
                     (uint *)((long)(in_RDI->super_state_base).m_match_hist + 4));
        }
        else {
          bVar1 = symbol_codec::encode
                            ((symbol_codec *)
                             CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                             in_stack_ffffffffffffff94,
                             (adaptive_bit_model *)
                             CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                             update_model);
          if (!bVar1) {
            return false;
          }
          if (iVar2 == -3) {
            bVar1 = symbol_codec::encode
                              ((symbol_codec *)
                               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                               in_stack_ffffffffffffff94,
                               (adaptive_bit_model *)
                               CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                               update_model);
            if (!bVar1) {
              return false;
            }
            uVar3 = *(uint *)((long)(in_RDI->super_state_base).m_match_hist + 8);
            *(uint *)((long)(in_RDI->super_state_base).m_match_hist + 8) =
                 *(uint *)((long)(in_RDI->super_state_base).m_match_hist + 4);
            *(uint *)((long)(in_RDI->super_state_base).m_match_hist + 4) =
                 (in_RDI->super_state_base).m_match_hist[0];
            (in_RDI->super_state_base).m_match_hist[0] = uVar3;
          }
          else {
            bVar1 = symbol_codec::encode
                              ((symbol_codec *)
                               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                               in_stack_ffffffffffffff94,
                               (adaptive_bit_model *)
                               CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                               update_model);
            if (!bVar1) {
              return false;
            }
            uVar3 = *(uint *)((long)(in_RDI->super_state_base).m_match_hist + 0xc);
            *(uint *)((long)(in_RDI->super_state_base).m_match_hist + 0xc) =
                 *(uint *)((long)(in_RDI->super_state_base).m_match_hist + 8);
            *(uint *)((long)(in_RDI->super_state_base).m_match_hist + 8) =
                 *(uint *)((long)(in_RDI->super_state_base).m_match_hist + 4);
            *(uint *)((long)(in_RDI->super_state_base).m_match_hist + 4) =
                 (in_RDI->super_state_base).m_match_hist[0];
            (in_RDI->super_state_base).m_match_hist[0] = uVar3;
          }
        }
        uVar3 = 0xb;
        if ((in_RDI->super_state_base).m_cur_state < 7) {
          uVar3 = 8;
        }
        (in_RDI->super_state_base).m_cur_state = uVar3;
      }
    }
    else {
      bVar1 = symbol_codec::encode
                        ((symbol_codec *)
                         CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                         in_stack_ffffffffffffff94,
                         (adaptive_bit_model *)
                         CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),bVar1);
      if (!bVar1) {
        return false;
      }
      CLZBase::compute_lzx_position_slot
                (in_RDX,in_R8->m_dist,(uint *)&stack0xffffffffffffff9c,
                 (uint *)&stack0xffffffffffffff98);
      local_70 = -1;
      if (in_R8->m_len < 9) {
        uVar4 = in_R8->m_len - 2;
      }
      else {
        uVar4 = 7;
        local_70 = in_R8->m_len + -9;
      }
      iVar2 = in_stack_ffffffffffffff9c - 1;
      uVar4 = uVar4 | iVar2 * 8;
      bVar1 = symbol_codec::encode
                        ((symbol_codec *)CONCAT44(iVar2,uVar4),in_stack_ffffffffffffff84,
                         (quasi_adaptive_huffman_data_model *)in_RSI);
      if (!bVar1) {
        return false;
      }
      if ((-1 < local_70) &&
         (bVar1 = symbol_codec::encode
                            ((symbol_codec *)CONCAT44(iVar2,uVar4),in_stack_ffffffffffffff84,
                             (quasi_adaptive_huffman_data_model *)in_RSI), !bVar1)) {
        return false;
      }
      sym = (uint)(in_RDX->super_CLZDecompBase).m_lzx_position_extra_bits[in_stack_ffffffffffffff9c]
      ;
      uVar3 = (uint)((ulong)in_RDI >> 0x20);
      if (sym < 3) {
        bVar1 = symbol_codec::encode_bits((symbol_codec *)in_RSI,uVar3,(uint)in_RDI);
        if (!bVar1) {
          return false;
        }
      }
      else {
        if ((4 < sym) &&
           (bVar1 = symbol_codec::encode_bits((symbol_codec *)in_RSI,uVar3,(uint)in_RDI), !bVar1)) {
          return false;
        }
        bVar1 = symbol_codec::encode
                          ((symbol_codec *)CONCAT44(iVar2,uVar4),sym,
                           (quasi_adaptive_huffman_data_model *)in_RSI);
        if (!bVar1) {
          return false;
        }
      }
      update_match_hist(in_RDI,in_R8->m_dist);
      uVar3 = 10;
      if ((in_RDI->super_state_base).m_cur_state < 7) {
        uVar3 = 7;
      }
      (in_RDI->super_state_base).m_cur_state = uVar3;
    }
  }
  else {
    search_accelerator::operator[]((search_accelerator *)in_RDI,in_stack_ffffffffffffff6c);
    if ((in_RDI->super_state_base).m_cur_state < 7) {
      get_pred_char(in_RSI,(search_accelerator *)in_RDI,in_stack_ffffffffffffff6c,
                    in_stack_ffffffffffffff68);
      bVar1 = symbol_codec::encode
                        ((symbol_codec *)
                         CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                         in_stack_ffffffffffffff84,(quasi_adaptive_huffman_data_model *)in_RSI);
      if (!bVar1) {
        return false;
      }
    }
    else {
      search_accelerator::operator[]((search_accelerator *)in_RDI,in_stack_ffffffffffffff6c);
      search_accelerator::operator[]((search_accelerator *)in_RDI,in_stack_ffffffffffffff6c);
      bVar1 = symbol_codec::encode
                        ((symbol_codec *)
                         CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                         in_stack_ffffffffffffff84,(quasi_adaptive_huffman_data_model *)in_RSI);
      if (!bVar1) {
        return false;
      }
    }
    if ((in_RDI->super_state_base).m_cur_state < 4) {
      (in_RDI->super_state_base).m_cur_state = 0;
    }
    else if ((in_RDI->super_state_base).m_cur_state < 10) {
      (in_RDI->super_state_base).m_cur_state = (in_RDI->super_state_base).m_cur_state - 3;
    }
    else {
      (in_RDI->super_state_base).m_cur_state = (in_RDI->super_state_base).m_cur_state - 6;
    }
  }
  iVar2 = in_R8->m_pos;
  uVar3 = lzdecision::get_len((lzdecision *)0x11ae02);
  (in_RDI->super_state_base).m_cur_ofs = iVar2 + uVar3;
  return true;
}

Assistant:

bool lzcompressor::state::encode(symbol_codec& codec, CLZBase& lzbase, const search_accelerator& dict, const lzdecision& lzdec)
   {
      const uint lit_pred0 = get_pred_char(dict, lzdec.m_pos, 1);

      uint is_match_model_index = LZHAM_COMPUTE_IS_MATCH_MODEL_INDEX(lit_pred0, m_cur_state);
      if (!codec.encode(lzdec.is_match(), m_is_match_model[is_match_model_index])) return false;

      if (!lzdec.is_match())
      {
         const uint lit = dict[lzdec.m_pos];

#ifdef LZHAM_LZDEBUG
         if (!codec.encode_bits(lit, 8)) return false;
#endif

         if (m_cur_state < CLZBase::cNumLitStates)
         {
            const uint lit_pred1 = get_pred_char(dict, lzdec.m_pos, 2);

            uint lit_pred = (lit_pred0 >> (8 - CLZBase::cNumLitPredBits/2)) |
               (((lit_pred1 >> (8 - CLZBase::cNumLitPredBits/2)) << CLZBase::cNumLitPredBits/2));

            // literal
            if (!codec.encode(lit, m_lit_table[lit_pred])) return false;
         }
         else
         {
            // delta literal
            const uint rep_lit0 = dict[(lzdec.m_pos - m_match_hist[0]) & dict.m_max_dict_size_mask];
            const uint rep_lit1 = dict[(lzdec.m_pos - m_match_hist[0] - 1) & dict.m_max_dict_size_mask];

            uint delta_lit = rep_lit0 ^ lit;

            uint lit_pred = (rep_lit0 >> (8 - CLZBase::cNumDeltaLitPredBits/2)) |
                            ((rep_lit1 >> (8 - CLZBase::cNumDeltaLitPredBits/2)) << CLZBase::cNumDeltaLitPredBits/2);

#ifdef LZHAM_LZDEBUG
            if (!codec.encode_bits(rep_lit0, 8)) return false;
#endif

            if (!codec.encode(delta_lit, m_delta_lit_table[lit_pred])) return false;
         }

         if (m_cur_state < 4) m_cur_state = 0; else if (m_cur_state < 10) m_cur_state -= 3; else m_cur_state -= 6;
      }
      else
      {
         // match
         if (lzdec.m_dist < 0)
         {
            // rep match
            if (!codec.encode(1, m_is_rep_model[m_cur_state])) return false;

            int match_hist_index = -lzdec.m_dist - 1;

            if (!match_hist_index)
            {
               // rep0 match
               if (!codec.encode(1, m_is_rep0_model[m_cur_state])) return false;

               if (lzdec.m_len == 1)
               {
                  // single byte rep0
                  if (!codec.encode(1, m_is_rep0_single_byte_model[m_cur_state])) return false;

                  m_cur_state = (m_cur_state < CLZBase::cNumLitStates) ? 9 : 11;
               }
               else
               {
                  // normal rep0
                  if (!codec.encode(0, m_is_rep0_single_byte_model[m_cur_state])) return false;

                  if (!codec.encode(lzdec.m_len - cMinMatchLen, m_rep_len_table[m_cur_state >= CLZBase::cNumLitStates])) return false;

                  m_cur_state = (m_cur_state < CLZBase::cNumLitStates) ? 8 : 11;
               }
            }
            else
            {
               // rep1-rep3 match
               if (!codec.encode(0, m_is_rep0_model[m_cur_state])) return false;

               if (!codec.encode(lzdec.m_len - cMinMatchLen, m_rep_len_table[m_cur_state >= CLZBase::cNumLitStates])) return false;

               if (match_hist_index == 1)
               {
                  // rep1
                  if (!codec.encode(1, m_is_rep1_model[m_cur_state])) return false;

                  std::swap(m_match_hist[0], m_match_hist[1]);
               }
               else
               {
                  if (!codec.encode(0, m_is_rep1_model[m_cur_state])) return false;

                  if (match_hist_index == 2)
                  {
                     // rep2
                     if (!codec.encode(1, m_is_rep2_model[m_cur_state])) return false;

                     int dist = m_match_hist[2];
                     m_match_hist[2] = m_match_hist[1];
                     m_match_hist[1] = m_match_hist[0];
                     m_match_hist[0] = dist;
                  }
                  else
                  {
                     // rep3
                     if (!codec.encode(0, m_is_rep2_model[m_cur_state])) return false;

                     int dist = m_match_hist[3];
                     m_match_hist[3] = m_match_hist[2];
                     m_match_hist[2] = m_match_hist[1];
                     m_match_hist[1] = m_match_hist[0];
                     m_match_hist[0] = dist;
                  }
               }

               m_cur_state = (m_cur_state < CLZBase::cNumLitStates) ? 8 : 11;
            }
         }
         else
         {
            if (!codec.encode(0, m_is_rep_model[m_cur_state])) return false;

            LZHAM_ASSERT(lzdec.m_len >= cMinMatchLen);

            // full match
            uint match_slot, match_extra;
            lzbase.compute_lzx_position_slot(lzdec.m_dist, match_slot, match_extra);

            uint match_low_sym = 0;
            int large_len_sym = -1;
            if (lzdec.m_len >= 9)
            {
               match_low_sym = 7;

               large_len_sym = lzdec.m_len - 9;
            }
            else
               match_low_sym = lzdec.m_len - 2;

            uint match_high_sym = 0;

            LZHAM_ASSERT(match_slot >= CLZBase::cLZXLowestUsableMatchSlot && (match_slot < lzbase.m_num_lzx_slots));
            match_high_sym = match_slot - CLZBase::cLZXLowestUsableMatchSlot;

            uint main_sym = match_low_sym | (match_high_sym << 3);

            if (!codec.encode(CLZBase::cLZXNumSpecialLengths + main_sym, m_main_table)) return false;

            if (large_len_sym >= 0)
            {
               if (!codec.encode(large_len_sym, m_large_len_table[m_cur_state >= CLZBase::cNumLitStates])) return false;
            }

            uint num_extra_bits = lzbase.m_lzx_position_extra_bits[match_slot];
            if (num_extra_bits < 3)
            {
               if (!codec.encode_bits(match_extra, num_extra_bits)) return false;
            }
            else
            {
               if (num_extra_bits > 4)
               {
                  if (!codec.encode_bits((match_extra >> 4), num_extra_bits - 4)) return false;
               }

               if (!codec.encode(match_extra & 15, m_dist_lsb_table)) return false;
            }

            update_match_hist(lzdec.m_dist);

            m_cur_state = (m_cur_state < CLZBase::cNumLitStates) ? CLZBase::cNumLitStates : CLZBase::cNumLitStates + 3;
         }

#ifdef LZHAM_LZDEBUG
         if (!codec.encode_bits(m_match_hist[0], 29)) return false;
#endif
      }

      m_cur_ofs = lzdec.m_pos + lzdec.get_len();
      return true;
   }